

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<MakefileGenerator::Compiler>::
emplace<MakefileGenerator::Compiler_const&>
          (QMovableArrayOps<MakefileGenerator::Compiler> *this,qsizetype i,Compiler *args)

{
  Compiler **ppCVar1;
  Compiler *pCVar2;
  undefined4 uVar3;
  Data *pDVar4;
  long lVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  undefined4 uVar10;
  Compiler *pCVar9;
  uint uVar11;
  qsizetype *pqVar12;
  bool bVar13;
  
  pDVar4 = (this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
           super_QArrayDataPointer<MakefileGenerator::Compiler>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00188321:
    pDVar6 = (args->variable_in).d.d;
    pcVar7 = (args->variable_in).d.ptr;
    qVar8 = (args->variable_in).d.size;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
    uVar3 = args->flags;
    uVar10 = args->type;
    bVar13 = (this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
             super_QArrayDataPointer<MakefileGenerator::Compiler>.size != 0;
    QArrayDataPointer<MakefileGenerator::Compiler>::detachAndGrow
              ((QArrayDataPointer<MakefileGenerator::Compiler> *)this,(uint)(i == 0 && bVar13),1,
               (Compiler **)0x0,(QArrayDataPointer<MakefileGenerator::Compiler> *)0x0);
    pCVar9 = (this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
             super_QArrayDataPointer<MakefileGenerator::Compiler>.ptr;
    if (i != 0 || !bVar13) {
      pCVar2 = pCVar9 + i;
      memmove(pCVar2 + 1,pCVar9 + i,
              ((this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
               super_QArrayDataPointer<MakefileGenerator::Compiler>.size - i) * 0x20);
      (pCVar2->variable_in).d.d = pDVar6;
      (pCVar2->variable_in).d.ptr = pcVar7;
      (pCVar2->variable_in).d.size = qVar8;
      pCVar2->flags = uVar3;
      pCVar2->type = uVar10;
      goto LAB_001883d9;
    }
    pCVar9[-1].variable_in.d.d = pDVar6;
    pCVar9[-1].variable_in.d.ptr = pcVar7;
    pCVar9[-1].variable_in.d.size = qVar8;
    pCVar9[-1].flags = uVar3;
    pCVar9[-1].type = uVar10;
  }
  else {
    lVar5 = (this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
            super_QArrayDataPointer<MakefileGenerator::Compiler>.size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
                      super_QArrayDataPointer<MakefileGenerator::Compiler>.ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
        lVar5)) {
      pCVar9 = (this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
               super_QArrayDataPointer<MakefileGenerator::Compiler>.ptr;
      pDVar6 = (args->variable_in).d.d;
      pCVar9[lVar5].variable_in.d.d = pDVar6;
      pCVar9[lVar5].variable_in.d.ptr = (args->variable_in).d.ptr;
      pCVar9[lVar5].variable_in.d.size = (args->variable_in).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      uVar11 = args->type;
      pCVar9[lVar5].flags = args->flags;
      pCVar9[lVar5].type = uVar11;
      goto LAB_001883d9;
    }
    if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
       ((Compiler *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
        (this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
        super_QArrayDataPointer<MakefileGenerator::Compiler>.ptr)) goto LAB_00188321;
    pCVar9 = (this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
             super_QArrayDataPointer<MakefileGenerator::Compiler>.ptr;
    pDVar6 = (args->variable_in).d.d;
    pCVar9[-1].variable_in.d.d = pDVar6;
    pCVar9[-1].variable_in.d.ptr = (args->variable_in).d.ptr;
    pCVar9[-1].variable_in.d.size = (args->variable_in).d.size;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
    uVar11 = args->type;
    pCVar9[-1].flags = args->flags;
    pCVar9[-1].type = uVar11;
  }
  ppCVar1 = &(this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
             super_QArrayDataPointer<MakefileGenerator::Compiler>.ptr;
  *ppCVar1 = *ppCVar1 + -1;
LAB_001883d9:
  pqVar12 = &(this->super_QGenericArrayOps<MakefileGenerator::Compiler>).
             super_QArrayDataPointer<MakefileGenerator::Compiler>.size;
  *pqVar12 = *pqVar12 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }